

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.hpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerHLSL::TextureSizeVariants::TextureSizeVariants(TextureSizeVariants *this)

{
  uint64_t *u;
  uint64_t *__end3;
  uint64_t *__begin3;
  uint64_t (*__range3) [4];
  uint64_t (*unorm) [4];
  uint64_t (*__end2) [4];
  uint64_t (*__begin2) [4];
  uint64_t (*__range2) [3] [4];
  TextureSizeVariants *this_local;
  
  this->srv = 0;
  for (__end2 = this->uav; (TextureSizeVariants *)__end2 != this + 1; __end2 = __end2 + 1) {
    for (__end3 = *__end2; (uint64_t (*) [4])__end3 != __end2 + 1; __end3 = __end3 + 1) {
      *__end3 = 0;
    }
  }
  return;
}

Assistant:

TextureSizeVariants()
		{
			srv = 0;
			for (auto &unorm : uav)
				for (auto &u : unorm)
					u = 0;
		}